

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall Logger::start(Logger *this)

{
  thread *in_RDI;
  Logger *in_stack_00000038;
  Logger *in_stack_000001e0;
  thread *in_stack_ffffffffffffffa8;
  Logger *in_stack_ffffffffffffffd0;
  type *in_stack_ffffffffffffffd8;
  thread *in_stack_ffffffffffffffe0;
  
  *(undefined1 *)&(in_RDI->_M_id)._M_thread = 1;
  getDate_abi_cxx11_(in_stack_00000038);
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),(string *)&stack0xffffffffffffffd8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  createLogDir(in_stack_000001e0);
  createLogFile(in_stack_ffffffffffffffd0);
  std::thread::thread<Logger::start()::_lambda()_1_,,void>
            (in_stack_ffffffffffffffe0,(type *)in_stack_ffffffffffffffd8);
  std::thread::operator=(in_RDI,in_stack_ffffffffffffffa8);
  std::thread::~thread((thread *)0x10fc1a);
  std::thread::thread<Logger::start()::_lambda()_2_,,void>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  std::thread::operator=(in_RDI,in_stack_ffffffffffffffa8);
  std::thread::~thread((thread *)0x10fc53);
  usleep(100000);
  return;
}

Assistant:

inline void start() 
    {
        running = true;
        logCreateDate = getDate();  // 获取当前日期
        createLogDir();     // 创建日志目录
        createLogFile();    // 创建日志文件
        // 启动日志处理线程
        logThread = std::thread([this]() {
            // std::cout << "日志处理线程启动" << std::endl;
            while(running) {
                while(!logQueue.empty())  {
                    std::unique_lock<std::mutex> lock(logQueueMtx);  // 加锁
                    cv.wait(lock, [this]() { return !logQueue.empty() || !running; });
                    if (!running) break;
                    auto& msg = logQueue.front();
                    if(msg.level >= logLevel) writeLog(msg.level, msg.time, msg.message); // 写入日志
                    logQueue.pop();
                }
                LOG_SLEEP(10); // 等待10毫秒
            }
            // std::cout << "日志处理线程结束" << std::endl;
        });
        // 启动定时器线程,定时读取日志配置文件
        timerThread = std::thread([this]() {
            // std::cout << "定时器线程启动" << std::endl;
            while(running) {
                if (this->checkConfigFileChange()) {
                    this->loadConfig();
                }
                std::this_thread::sleep_for(std::chrono::seconds(5));
            }
            // std::cout << "定时器线程结束" << std::endl;
        });
        LOG_SLEEP(100); // 等待日志处理线程启动
    }